

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O0

int __thiscall
CVmObjDate::getp_getDate(CVmObjDate *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  int *in_RCX;
  vm_val_t *in_RDX;
  caldate_t cd;
  int32_t dayno;
  uint argc;
  undefined4 in_stack_ffffffffffffff88;
  int32_t in_stack_ffffffffffffff8c;
  caldate_t *in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  int local_5c;
  caldate_t local_4c;
  int32_t local_40;
  int local_2c;
  vm_val_t *local_20;
  
  if (in_RCX == (int *)0x0) {
    local_5c = 0;
  }
  else {
    local_5c = *in_RCX;
  }
  local_2c = local_5c;
  local_20 = in_RDX;
  if ((getp_getDate(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_getDate(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_getDate::desc,0,1);
    __cxa_guard_release(&getp_getDate(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                     (uint *)in_stack_ffffffffffffff90,
                     (CVmNativeCodeDesc *)
                     CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if (iVar1 == 0) {
    get_tz_arg(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
    local_40 = get_local_date((CVmObjDate *)in_stack_ffffffffffffff90,
                              (CVmTimeZone *)
                              CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    caldate_t::caldate_t(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    iVar1 = caldate_t::weekday(&local_4c);
    make_int_list(local_20,4,(ulong)(uint)local_4c.y,(ulong)(uint)local_4c.m,(ulong)(uint)local_4c.d
                  ,(ulong)(iVar1 + 1));
    CVmStack::discard(local_2c);
  }
  return 1;
}

Assistant:

int CVmObjDate::getp_getDate(VMG_ vm_obj_id_t self,
                             vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(0, 1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get my date in local time */
    int32_t dayno = get_local_date(get_tz_arg(vmg_ 0, argc));

    /* express it as a calendar date */
    caldate_t cd(dayno);

    /* return [year, month, monthday, weekday] */
    make_int_list(vmg_ retval, 4, cd.y, cd.m, cd.d, cd.weekday() + 1);

    /* discard arguments */
    G_stk->discard(argc);

    /* handled */
    return TRUE;
}